

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

void __thiscall
duckdb::BindContext::AddBaseTable
          (BindContext *this,idx_t index,string *alias,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,
          vector<duckdb::ColumnIndex,_true> *bound_column_ids,string *table_name)

{
  Binding *local_60;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_58;
  idx_t index_local;
  void *local_48;
  virtual_column_map_t virtual_columns;
  
  virtual_columns._M_h._M_buckets = &virtual_columns._M_h._M_single_bucket;
  virtual_columns._M_h._M_bucket_count = 1;
  virtual_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  virtual_columns._M_h._M_element_count = 0;
  virtual_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  virtual_columns._M_h._M_rehash_policy._M_next_resize = 0;
  virtual_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (alias->_M_string_length == 0) {
    alias = table_name;
  }
  local_48 = (void *)0x0;
  index_local = index;
  make_uniq<duckdb::TableBinding,std::__cxx11::string_const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::ColumnIndex,true>&,decltype(nullptr),unsigned_long&,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
            ((duckdb *)&local_60,alias,types,names,bound_column_ids,&local_48,&index_local,
             &virtual_columns);
  local_58._M_head_impl = local_60;
  local_60 = (Binding *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
              *)&this->bindings_list,
             (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)&local_58);
  if (local_58._M_head_impl != (Binding *)0x0) {
    (*(local_58._M_head_impl)->_vptr_Binding[1])();
  }
  local_58._M_head_impl = (Binding *)0x0;
  if (local_60 != (Binding *)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&virtual_columns._M_h);
  return;
}

Assistant:

void BindContext::AddBaseTable(idx_t index, const string &alias, const vector<string> &names,
                               const vector<LogicalType> &types, vector<ColumnIndex> &bound_column_ids,
                               const string &table_name) {
	virtual_column_map_t virtual_columns;
	AddBinding(make_uniq<TableBinding>(alias.empty() ? table_name : alias, types, names, bound_column_ids, nullptr,
	                                   index, std::move(virtual_columns)));
}